

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int balance(BtCursor *pCur)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  u8 *pSpace;
  int iIdx;
  MemPage *pParent;
  MemPage *pPage;
  int iPage;
  u8 *pFree;
  int rc;
  u8 aBalanceQuickSpace [13];
  int in_stack_00000120;
  int in_stack_00000124;
  u8 *in_stack_00000128;
  int in_stack_00000134;
  MemPage *in_stack_00000138;
  BtCursor *in_stack_ffffffffffffff98;
  MemPage **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  MemPage *pPage_00;
  MemPage *pParent_00;
  undefined4 in_stack_ffffffffffffffc8;
  MemPage **local_30;
  int local_24;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  local_30 = (MemPage **)0x0;
  while (((pParent_00 = *(MemPage **)(in_RDI + 0x88), -1 < pParent_00->nFree ||
          (iVar2 = btreeComputeFreeSpace((MemPage *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8)),
          iVar2 == 0)) &&
         ((pParent_00->nOverflow != '\0' ||
          (iVar3 = pParent_00->nFree * 3, iVar2 = *(int *)(*(long *)(in_RDI + 0x20) + 0x38),
          iVar4 = iVar2 * 2, iVar3 != iVar4 && SBORROW4(iVar3,iVar4) == iVar3 + iVar2 * -2 < 0)))))
  {
    iVar2 = (int)*(char *)(in_RDI + 0x54);
    if (iVar2 == 0) {
      if ((pParent_00->nOverflow == '\0') ||
         (local_24 = anotherValidCursor(in_stack_ffffffffffffff98), local_24 != 0)) break;
      local_24 = balance_deeper((MemPage *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8);
      if (local_24 == 0) {
        *(undefined1 *)(in_RDI + 0x54) = 1;
        *(undefined2 *)(in_RDI + 0x56) = 0;
        *(undefined2 *)(in_RDI + 0x58) = 0;
        *(MemPage **)(in_RDI + 0x90) = pParent_00;
        *(undefined8 *)(in_RDI + 0x88) = *(undefined8 *)(in_RDI + 0x98);
      }
    }
    else {
      iVar3 = sqlite3PagerPageRefcount((DbPage *)0x192ef0);
      if (iVar3 < 2) {
        pPage_00 = *(MemPage **)(in_RDI + 0x90 + (long)(iVar2 + -1) * 8);
        in_stack_ffffffffffffffb4 = (uint)*(ushort *)(in_RDI + 0x58 + (long)(iVar2 + -1) * 2);
        local_24 = sqlite3PagerWrite((PgHdr *)in_stack_ffffffffffffff98);
        if ((local_24 == 0) && (pPage_00->nFree < 0)) {
          local_24 = btreeComputeFreeSpace((MemPage *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
        }
        if (local_24 == 0) {
          if ((((pParent_00->intKeyLeaf == '\0') || (pParent_00->nOverflow != '\x01')) ||
              (pParent_00->aiOvfl[0] != pParent_00->nCell)) ||
             ((pPage_00->pgno == 1 || (pPage_00->nCell != in_stack_ffffffffffffffb4)))) {
            in_stack_ffffffffffffffa8 = (MemPage **)sqlite3PageMalloc(0);
            local_24 = balance_nonroot(in_stack_00000138,in_stack_00000134,in_stack_00000128,
                                       in_stack_00000124,in_stack_00000120);
            bVar5 = local_30 != (MemPage **)0x0;
            local_30 = in_stack_ffffffffffffffa8;
            if (bVar5) {
              sqlite3PageFree((void *)0x193039);
              local_30 = in_stack_ffffffffffffffa8;
            }
          }
          else {
            local_24 = balance_quick(pParent_00,pPage_00,
                                     (u8 *)CONCAT44(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0));
          }
        }
        pParent_00->nOverflow = '\0';
        releasePage((MemPage *)0x193058);
        *(char *)(in_RDI + 0x54) = *(char *)(in_RDI + 0x54) + -1;
        *(undefined8 *)(in_RDI + 0x88) =
             *(undefined8 *)(in_RDI + 0x90 + (long)*(char *)(in_RDI + 0x54) * 8);
      }
      else {
        local_24 = sqlite3CorruptError(0);
      }
    }
    if (local_24 != 0) break;
  }
  if (local_30 != (MemPage **)0x0) {
    sqlite3PageFree((void *)0x1930ac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_24;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( pPage->nOverflow==0 && pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
      /* No rebalance required as long as:
      **   (1) There are no overflow cells
      **   (2) The amount of free space on the page is less than 2/3rds of
      **       the total usable space on the page. */
      break;
    }else if( (iPage = pCur->iPage)==0 ){
      if( pPage->nOverflow && (rc = anotherValidCursor(pCur))==SQLITE_OK ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( sqlite3PagerPageRefcount(pPage->pDbPage)>1 ){
      /* The page being written is not a root page, and there is currently
      ** more than one reference to it. This only happens if the page is one
      ** of its own ancestor pages. Corruption. */
      rc = SQLITE_CORRUPT_PAGE(pPage);
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer.
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 );
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          **
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below.
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot()
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}